

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# synth_core.cpp
# Opt level: O2

void __thiscall
V2DCFilter::renderStereo(V2DCFilter *this,StereoSample *dest,StereoSample *src,int nsamples)

{
  float fVar1;
  ulong uVar2;
  ulong uVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  
  fVar1 = this->inst->SRfcdcfilter;
  fVar7 = (this->fl).xm1;
  fVar4 = (this->fl).ym1;
  fVar6 = (this->fr).xm1;
  fVar5 = (this->fr).ym1;
  uVar2 = 0;
  uVar3 = (ulong)(uint)nsamples;
  if (nsamples < 1) {
    uVar3 = uVar2;
  }
  for (; uVar3 != uVar2; uVar2 = uVar2 + 1) {
    fVar4 = (fVar4 * fVar1 + 3.8146973e-06) - fVar7;
    fVar7 = src[uVar2].field_0.l;
    fVar4 = fVar4 + fVar7 + -3.8146973e-06;
    dest[uVar2].field_0.l = fVar4;
    fVar5 = (fVar5 * fVar1 + 3.8146973e-06) - fVar6;
    fVar6 = *(float *)((long)src + uVar2 * 8 + 4);
    fVar5 = fVar5 + fVar6 + -3.8146973e-06;
    *(float *)((long)dest + uVar2 * 8 + 4) = fVar5;
  }
  (this->fl).xm1 = fVar7;
  (this->fl).ym1 = fVar4;
  (this->fr).xm1 = fVar6;
  (this->fr).ym1 = fVar5;
  return;
}

Assistant:

void renderStereo(StereoSample *dest, const StereoSample *src, int nsamples)
    {
        float R = inst->SRfcdcfilter;

        V2DCF l = fl;
        V2DCF r = fr;
        for (int i=0; i < nsamples; i++)
        {
            dest[i].l = l.step(src[i].l, R);
            dest[i].r = r.step(src[i].r, R);
        }
        fl = l;
        fr = r;
    }